

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O2

int get_floor_type(char c)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = what_map_char(c);
  if (bVar1 == 0x7f) {
    lc_warning("Invalid fill character \'%c\' in MAZE declaration",(ulong)(uint)(int)c);
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

int get_floor_type(char c)
{
	int val;

	val = what_map_char(c);
	if (val == INVALID_TYPE) {
	    val = ERR;
	    lc_warning("Invalid fill character '%c' in MAZE declaration", c);
	}
	return val;
}